

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_map.hpp
# Opt level: O3

fixed_size_map_iterator<duckdb::list_entry_t,_true> * __thiscall
duckdb::fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++
          (fixed_size_map_iterator<duckdb::list_entry_t,_true> *this)

{
  uchar *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar6 = this->entry_idx;
  uVar2 = this->idx_in_entry + 1;
  this->idx_in_entry = uVar2;
  if (uVar2 == 8) {
    iVar6 = iVar6 + 1;
    this->entry_idx = iVar6;
    this->idx_in_entry = 0;
    uVar2 = 0;
  }
  uVar4 = this->map->capacity;
  uVar5 = uVar4 >> 3;
  uVar4 = (ulong)((uint)uVar4 & 7);
LAB_002c3829:
  uVar7 = iVar6;
  if ((uVar7 < uVar5) || ((uVar7 == uVar5 && (uVar2 < uVar4)))) {
    puVar1 = (this->map->occupied).validity_mask;
    if (puVar1[uVar7] != '\0') goto code_r0x002c3843;
    if (uVar7 != uVar5) goto LAB_002c3886;
    this->idx_in_entry = uVar4;
  }
  return this;
code_r0x002c3843:
  uVar8 = 8;
  if (uVar7 == uVar5) {
    uVar8 = uVar4;
  }
  uVar3 = uVar2;
  if (uVar2 < uVar8) {
    do {
      if ((puVar1[uVar7] >> ((uint)uVar2 & 0x1f) & 1) != 0) {
        return this;
      }
      uVar2 = uVar2 + 1;
      this->idx_in_entry = uVar2;
      uVar3 = uVar8;
    } while (uVar8 != uVar2);
  }
  if ((uVar7 != uVar5) || (uVar2 = uVar4, iVar6 = uVar5, uVar3 != uVar4)) {
LAB_002c3886:
    this->entry_idx = uVar7 + 1;
    this->idx_in_entry = 0;
    uVar2 = 0;
    iVar6 = uVar7 + 1;
  }
  goto LAB_002c3829;
}

Assistant:

fixed_size_map_iterator &operator++() {
		// Prefix increment
		if (++idx_in_entry == occupied_mask::BITS_PER_VALUE) {
			NextEntry();
		}
		// Loop until we find an occupied index, or until the end
		auto end = map.end();
		while (*this < end) {
			const auto &entry = map.occupied.GetValidityEntryUnsafe(entry_idx);
			if (entry == static_cast<uint8_t>(~occupied_mask::ValidityBuffer::MAX_ENTRY)) {
				// Entire entry is unoccupied, skip
				if (entry_idx == end.entry_idx) {
					// This is the last entry
					idx_in_entry = end.idx_in_entry;
					break;
				}
				NextEntry();
			} else {
				// One or more occupied in entry, loop over it
				const auto idx_to = entry_idx == end.entry_idx ? end.idx_in_entry : occupied_mask::BITS_PER_VALUE;
				for (; idx_in_entry < idx_to; idx_in_entry++) {
					if (map.occupied.RowIsValid(entry, idx_in_entry)) {
						// We found an occupied index
						return *this;
					}
				}
				// We did not find an occupied index
				if (*this != end) {
					NextEntry();
				}
			}
		}
		return *this;
	}